

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O2

bool __thiscall Pda::traverse(Pda *this,string *input)

{
  char cVar1;
  Pda *n;
  pointer ppNVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  __type _Var6;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *pvVar7;
  char *pcVar8;
  pointer ppTVar9;
  _Elt_pointer pcVar10;
  Node *pNVar11;
  Node *n_00;
  Pda *pPVar12;
  pointer ppNVar13;
  string *__lhs;
  string *__rhs;
  pointer ppTVar14;
  pointer ppNVar15;
  uint uVar16;
  ulong uVar17;
  bool bVar18;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> activeStates;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> newActives;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> eclos;
  map<const_char,_unsigned_int,_std::less<const_char>,_std::allocator<std::pair<const_char,_unsigned_int>_>_>
  counter;
  stack<char,_std::deque<char,_std::allocator<char>_>_> s;
  _Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> local_260;
  undefined1 local_248 [72];
  __normal_iterator<Tjen::Node_**,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>
  local_200;
  _Deque_base<char,_std::allocator<char>_> local_1f0;
  _Deque_base<char,_std::allocator<char>_> local_1a0;
  _Rb_tree<const_char,_std::pair<const_char,_unsigned_int>,_std::_Select1st<std::pair<const_char,_unsigned_int>_>,_std::less<const_char>,_std::allocator<std::pair<const_char,_unsigned_int>_>_>
  local_150;
  _Deque_base<char,_std::allocator<char>_> local_120;
  undefined1 local_d0 [160];
  
  std::stack<char,std::deque<char,std::allocator<char>>>::
  stack<std::deque<char,std::allocator<char>>,void>
            ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)(local_d0 + 0x50));
  local_1f0._M_impl.super__Deque_impl_data._M_map._0_1_ = 0x7a;
  std::deque<char,_std::allocator<char>_>::emplace_back<char>
            ((deque<char,_std::allocator<char>_> *)(local_d0 + 0x50),(char *)&local_1f0);
  pNVar11 = this->start;
  std::deque<char,_std::allocator<char>_>::deque
            ((deque<char,_std::allocator<char>_> *)local_d0,
             (deque<char,_std::allocator<char>_> *)(local_d0 + 0x50));
  pPVar12 = (Pda *)local_d0;
  Tjen::Node::setStack(pNVar11,(stack<char,_std::deque<char,_std::allocator<char>_>_> *)pPVar12);
  std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base
            ((_Deque_base<char,_std::allocator<char>_> *)local_d0);
  findEclosure((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)&local_260,pPVar12,this->start
              );
  local_248._32_8_ = this;
  for (uVar16 = 0; uVar17 = (ulong)uVar16,
      ppNVar13 = local_260._M_impl.super__Vector_impl_data._M_start,
      uVar17 < input->_M_string_length; uVar16 = uVar16 + 1) {
    local_248._16_8_ = 0;
    local_248._0_8_ = (Node **)0x0;
    local_248._8_8_ = 0;
    local_248._40_8_ = local_260._M_impl.super__Vector_impl_data._M_finish;
    while (ppNVar13 != (pointer)local_248._40_8_) {
      n = (Pda *)*ppNVar13;
      local_248._48_8_ = ppNVar13;
      initMap((map<const_char,_unsigned_int,_std::less<const_char>,_std::allocator<std::pair<const_char,_unsigned_int>_>_>
               *)&local_150,pPVar12,(Node *)n);
      pvVar7 = Tjen::Node::getTransitions((Node *)n);
      local_248._56_8_ =
           (pvVar7->
           super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      for (ppTVar14 = (pvVar7->
                      super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          ppTVar14 != (pointer)local_248._56_8_; ppTVar14 = ppTVar14 + 1) {
        cVar3 = Tjen::Node::Transition::getInput(*ppTVar14);
        cVar1 = (input->_M_dataplus)._M_p[uVar17];
        if (cVar3 == cVar1) {
          pcVar8 = Tjen::Node::Transition::getOldStack(*ppTVar14);
          cVar4 = *pcVar8;
          pPVar12 = n;
          Tjen::Node::getStack
                    ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&local_1f0,(Node *)n);
          ppTVar9 = (pointer)local_1f0._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1f0._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1f0._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppTVar9 = (pointer)(local_1f0._M_impl.super__Deque_impl_data._M_finish._M_node[-1] +
                               0x200);
          }
          if (cVar4 != *(char *)((long)ppTVar9 + -1)) goto LAB_001287f0;
          std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_1f0);
LAB_001288d6:
          pNVar11 = (Node *)operator_new(0x88);
          n_00 = Tjen::Node::Transition::getTo(*ppTVar14);
          Tjen::Node::Node(pNVar11,n_00);
          Tjen::Node::getStack
                    ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&local_120,(Node *)n);
          Tjen::Node::setStack
                    (pNVar11,(stack<char,_std::deque<char,_std::allocator<char>_>_> *)&local_120);
          std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_120);
          pPVar12 = (Pda *)Tjen::Node::Transition::getNewstack_abi_cxx11_(*ppTVar14);
          Tjen::Node::editStack(pNVar11,(string *)pPVar12);
          findEclosure((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)(local_248 + 0x40),
                       pPVar12,pNVar11);
          pPVar12 = (Pda *)local_248._0_8_;
          std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>::
          insert<__gnu_cxx::__normal_iterator<Tjen::Node**,std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>>,void>
                    ((vector<Tjen::Node*,std::allocator<Tjen::Node*>> *)local_248,
                     (const_iterator)local_248._0_8_,
                     (__normal_iterator<Tjen::Node_**,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>
                      )local_248._64_8_,local_200);
          std::_Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::~_Vector_base
                    ((_Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)(local_248 + 0x40)
                    );
        }
        else {
LAB_001287f0:
          cVar4 = Tjen::Node::Transition::getInput(*ppTVar14);
          if (cVar4 == ' ') {
            pcVar8 = Tjen::Node::Transition::getOldStack(*ppTVar14);
            cVar5 = *pcVar8;
            pPVar12 = n;
            Tjen::Node::getStack
                      ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&local_1a0,(Node *)n
                      );
            pcVar10 = local_1a0._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1a0._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1a0._M_impl.super__Deque_impl_data._M_finish._M_first) {
              pcVar10 = local_1a0._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x200;
            }
            bVar18 = true;
            if (cVar5 != pcVar10[-1]) goto LAB_0012885c;
LAB_001288a4:
            std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_1a0);
          }
          else {
LAB_0012885c:
            cVar5 = Tjen::Node::Transition::getInput(*ppTVar14);
            if (cVar5 == (input->_M_dataplus)._M_p[uVar17]) {
              pcVar8 = Tjen::Node::Transition::getOldStack(*ppTVar14);
              bVar18 = true;
              if (*pcVar8 != ' ') goto LAB_0012887e;
            }
            else {
LAB_0012887e:
              cVar5 = Tjen::Node::Transition::getInput(*ppTVar14);
              if (cVar5 == ' ') {
                pcVar8 = Tjen::Node::Transition::getOldStack(*ppTVar14);
                bVar18 = *pcVar8 == ' ';
              }
              else {
                bVar18 = false;
              }
            }
            if (cVar4 == ' ') goto LAB_001288a4;
          }
          if (cVar3 == cVar1) {
            std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_1f0);
          }
          if (bVar18) goto LAB_001288d6;
        }
      }
      std::
      _Rb_tree<const_char,_std::pair<const_char,_unsigned_int>,_std::_Select1st<std::pair<const_char,_unsigned_int>_>,_std::less<const_char>,_std::allocator<std::pair<const_char,_unsigned_int>_>_>
      ::~_Rb_tree(&local_150);
      ppNVar13 = (pointer)(local_248._48_8_ + 8);
    }
    pPVar12 = (Pda *)local_248;
    std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::operator=
              ((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)&local_260,
               (vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)local_248);
    std::_Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::~_Vector_base
              ((_Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)local_248);
  }
  for (; ppNVar13 != local_260._M_impl.super__Vector_impl_data._M_finish; ppNVar13 = ppNVar13 + 1) {
    pNVar11 = *ppNVar13;
    ppNVar15 = (((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)(local_248._32_8_ + 0x60))->
               super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    ppNVar2 = *(pointer *)(local_248._32_8_ + 0x68);
    while (ppNVar15 != ppNVar2) {
      __lhs = Tjen::Node::getName_abi_cxx11_(*ppNVar15);
      __rhs = Tjen::Node::getName_abi_cxx11_(pNVar11);
      _Var6 = std::operator==(__lhs,__rhs);
      ppNVar15 = ppNVar15 + 1;
      if (_Var6) goto LAB_001289f2;
    }
  }
LAB_001289f2:
  std::_Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::~_Vector_base(&local_260);
  std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base
            ((_Deque_base<char,_std::allocator<char>_> *)(local_d0 + 0x50));
  return ppNVar13 != local_260._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool Pda::traverse(std::string input) {

    //init
    std::stack<char> s;
    s.push('z');
    this->getStart()->setStack(s);
    std::vector<Tjen::Node*> activeStates = {findEclosure(this->getStart())};


    //begin traverse
    for (unsigned int i = 0; i < input.size(); ++i) {
        std::vector<Tjen::Node*> newActives;


        // loop over active states
        for(Tjen::Node* n: activeStates){
            std::map<const char, unsigned int> counter = initMap(n);
            // loop over transition
            for(auto& f: n->getTransitions()){
                if((f->getInput() == input[i] && f->getOldStack() == n->getStack().top()) || (f->getInput() == ' ' && f->getOldStack() == n->getStack().top()) || (f->getInput() == input[i] && f->getOldStack() == ' ') || (f->getInput() == ' ' && f->getOldStack() == ' ') ){

                    //eclosurre adden

                    Tjen::Node* next = new Tjen::Node(f->getTo());
                    next->setStack(n->getStack());
                    next->editStack(f->getNewstack());
                    std::vector<Tjen::Node*> eclos = findEclosure(next);

                    newActives.insert(newActives.begin(),eclos.begin() , eclos.end());


                }
            }
        }
        activeStates = newActives;

    }

    for(Tjen::Node* n : activeStates){
        for(Tjen::Node* end : this->getEndNodes()){
            if(end->getName() == n->getName()){
                return true;
            }
        }
    }
    return false;

}